

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O0

void __thiscall
absl::lts_20250127::synchronization_internal::anon_unknown_0::
Vec<absl::lts_20250127::synchronization_internal::(anonymous_namespace)::Node_*>::Grow
          (Vec<absl::lts_20250127::synchronization_internal::(anonymous_namespace)::Node_*> *this,
          uint32_t n)

{
  Node **__result;
  Node **copy;
  size_t request;
  uint32_t n_local;
  Vec<absl::lts_20250127::synchronization_internal::(anonymous_namespace)::Node_*> *this_local;
  
  while (this->capacity_ < n) {
    this->capacity_ = this->capacity_ << 1;
  }
  __result = (Node **)base_internal::LowLevelAlloc::AllocWithArena
                                ((ulong)this->capacity_ << 3,(anonymous_namespace)::arena);
  std::
  copy_n<absl::lts_20250127::synchronization_internal::(anonymous_namespace)::Node**,unsigned_int,absl::lts_20250127::synchronization_internal::(anonymous_namespace)::Node**>
            (this->ptr_,this->size_,__result);
  Discard(this);
  this->ptr_ = __result;
  return;
}

Assistant:

void Grow(uint32_t n) {
    while (capacity_ < n) {
      capacity_ *= 2;
    }
    size_t request = static_cast<size_t>(capacity_) * sizeof(T);
    T* copy = static_cast<T*>(
        base_internal::LowLevelAlloc::AllocWithArena(request, arena));
    std::copy_n(ptr_, size_, copy);
    Discard();
    ptr_ = copy;
  }